

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O0

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_back_by_c_str_Test<wchar_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_back_by_c_str_Test<wchar_t> *this)

{
  bool bVar1;
  wchar_t *__str;
  char *message;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *in_R9;
  AssertionHelper local_248;
  Fixed local_208;
  split_helper<const_wchar_t_*,_false,_true,_false> local_78;
  split_helper_subroutine<detail::get_back,_const_wchar_t_*,_wchar_t> local_70;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_68;
  wchar_t *local_58;
  undefined1 local_50 [8];
  AssertionResult iutest_ar;
  wchar_t *delim;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> s;
  iu_StringViewSplit_x_iutest_x_chain_back_by_c_str_Test<wchar_t> *this_local;
  
  s._M_str = (wchar_t *)this;
  __str = constant::arikitari_na_world_underscore<wchar_t>();
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&delim,__str);
  iutest_ar._32_8_ = anon_var_dwarf_4dd8f;
  iutest::detail::AlwaysZero();
  local_58 = constant::world<wchar_t>();
  local_78 = split<const_wchar_t_*,_nullptr>(L"_ ");
  back();
  local_70 = detail::split_helper<const_wchar_t_*,_false,_true,_false>::
             operator>><detail::get_back,_nullptr>(&local_78);
  local_68 = detail::
             operator|<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_const_wchar_t_*,_wchar_t,_nullptr>
                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&delim,&local_70);
  iutest::internal::EqHelper<false>::
  Compare<wchar_t_const*,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
            ((AssertionResult *)local_50,(EqHelper<false> *)"constant::world<char_type>()",
             "s | split(delim) >> back()",(char *)&local_58,(wchar_t **)&local_68,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    memset(&local_208,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_208);
    message = iutest::AssertionResult::message((AssertionResult *)local_50);
    iutest::AssertionHelper::AssertionHelper
              (&local_248,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0x39,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_248,&local_208);
    iutest::AssertionHelper::~AssertionHelper(&local_248);
    iutest::AssertionHelper::Fixed::~Fixed(&local_208);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_back_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	constexpr auto delim = constant::space_underscore<char_type>();
	IUTEST_ASSERT_EQ(constant::world<char_type>(), s | split(delim) >> back());
}